

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_crecord.c
# Opt level: O0

void recff_cdata_call(jit_State *J,RecordFFData *rd)

{
  TraceError e;
  int iVar1;
  cTValue *tv_00;
  GCcdata *pGVar2;
  cTValue *J_00;
  long in_RDI;
  MMS mm;
  cTValue *tv;
  CType *ct;
  CTypeID id;
  GCcdata *cd;
  CTState *cts;
  CType *ct_1;
  CTypeID in_stack_000000ac;
  RecordFFData *in_stack_000000b0;
  jit_State *in_stack_000000b8;
  undefined8 in_stack_ffffffffffffff50;
  TRef tr;
  undefined4 in_stack_ffffffffffffff58;
  int iVar3;
  cTValue *in_stack_ffffffffffffff60;
  undefined8 in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  CTState *local_68;
  GCcdata *in_stack_ffffffffffffffa8;
  RecordFFData *in_stack_ffffffffffffffb0;
  jit_State *in_stack_ffffffffffffffb8;
  
  tr = (TRef)((ulong)in_stack_ffffffffffffff50 >> 0x20);
  tv_00 = (cTValue *)(ulong)*(uint *)(in_RDI + -0xb4);
  pGVar2 = argv2cdata((jit_State *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                      (TRef)((ulong)in_stack_ffffffffffffff68 >> 0x20),in_stack_ffffffffffffff60);
  e = (TraceError)pGVar2->ctypeid;
  iVar3 = 9;
  if (e == LJ_TRERR_NOCACHE) {
    e = crec_constructor((jit_State *)&in_stack_ffffffffffffff60->field_2,
                         (GCcdata *)CONCAT44(9,in_stack_ffffffffffffff58),tr);
    iVar3 = 0x13;
  }
  else {
    iVar1 = crec_call(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8)
    ;
    if (iVar1 != 0) {
      return;
    }
  }
  for (local_68 = (CTState *)(tv_00->u64 + (ulong)e * 0x10); *(uint *)&local_68->tab >> 0x1c == 8;
      local_68 = (CTState *)(tv_00->u64 + (ulong)(*(uint *)&local_68->tab & 0xffff) * 0x10)) {
  }
  if (*(uint *)&local_68->tab >> 0x1c == 2) {
    e = *(TraceError *)&local_68->tab & 0xffff;
  }
  J_00 = lj_ctype_meta(local_68,(CTypeID)((ulong)in_stack_ffffffffffffff60 >> 0x20),
                       (MMS)in_stack_ffffffffffffff60);
  if (J_00 == (cTValue *)0x0) {
    if (iVar3 != 0x13) goto LAB_001b82db;
    crec_alloc(in_stack_000000b8,in_stack_000000b0,in_stack_000000ac);
  }
  else {
    if ((J_00->field_2).it != 0xfffffff7) {
LAB_001b82db:
      lj_trace_err((jit_State *)&tv_00->field_2,e);
    }
    crec_tailcall((jit_State *)&J_00->field_2,
                  (RecordFFData *)CONCAT44(iVar3,in_stack_ffffffffffffff58),tv_00);
  }
  return;
}

Assistant:

void LJ_FASTCALL recff_cdata_call(jit_State *J, RecordFFData *rd)
{
  CTState *cts = ctype_ctsG(J2G(J));
  GCcdata *cd = argv2cdata(J, J->base[0], &rd->argv[0]);
  CTypeID id = cd->ctypeid;
  CType *ct;
  cTValue *tv;
  MMS mm = MM_call;
  if (id == CTID_CTYPEID) {
    id = crec_constructor(J, cd, J->base[0]);
    mm = MM_new;
  } else if (crec_call(J, rd, cd)) {
    return;
  }
  /* Record ctype __call/__new metamethod. */
  ct = ctype_raw(cts, id);
  tv = lj_ctype_meta(cts, ctype_isptr(ct->info) ? ctype_cid(ct->info) : id, mm);
  if (tv) {
    if (tvisfunc(tv)) {
      crec_tailcall(J, rd, tv);
      return;
    }
  } else if (mm == MM_new) {
    crec_alloc(J, rd, id);
    return;
  }
  /* No metamethod or NYI: non-function metamethods. */
  lj_trace_err(J, LJ_TRERR_BADTYPE);
}